

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O2

uint aiGetMaterialTextureCount(aiMaterial *pMat,aiTextureType type)

{
  uint uVar1;
  aiMaterialProperty *paVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint i;
  ulong uVar6;
  
  if (pMat != (aiMaterial *)0x0) {
    uVar1 = pMat->mNumProperties;
    uVar5 = 0;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      paVar2 = pMat->mProperties[uVar6];
      if (paVar2 != (aiMaterialProperty *)0x0) {
        iVar3 = strcmp((paVar2->mKey).data,"$tex.file");
        if (((iVar3 == 0) && (paVar2->mSemantic == type)) &&
           (uVar4 = paVar2->mIndex + 1, uVar5 <= uVar4)) {
          uVar5 = uVar4;
        }
      }
    }
    return uVar5;
  }
  __assert_fail("pMat != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                ,0x147,"unsigned int aiGetMaterialTextureCount(const aiMaterial *, aiTextureType)");
}

Assistant:

unsigned int aiGetMaterialTextureCount(const C_STRUCT aiMaterial* pMat,
    C_ENUM aiTextureType type)
{
    ai_assert (pMat != NULL);

    // Textures are always stored with ascending indices (ValidateDS provides a check, so we don't need to do it again)
    unsigned int max = 0;
    for (unsigned int i = 0; i < pMat->mNumProperties;++i) {
        aiMaterialProperty* prop = pMat->mProperties[i];

        if ( prop /* just a sanity check ... */
            && 0 == strcmp( prop->mKey.data, _AI_MATKEY_TEXTURE_BASE )
            && prop->mSemantic == type) {

            max = std::max(max,prop->mIndex+1);
        }
    }
    return max;
}